

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.cpp
# Opt level: O0

ostream * pstore::repo::operator<<(ostream *os,value_type *ld)

{
  ostream *poVar1;
  value_type *ld_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"{compilation:");
  poVar1 = pstore::operator<<(poVar1,&ld->compilation);
  poVar1 = std::operator<<(poVar1,", index:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ld->index);
  poVar1 = std::operator<<(poVar1,", unused:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,ld->unused);
  poVar1 = std::operator<<(poVar1,", pointer:");
  poVar1 = pstore::operator<<(poVar1,&ld->pointer);
  poVar1 = std::operator<<(poVar1,'}');
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, linked_definitions::value_type const & ld) {
            return os << "{compilation:" << ld.compilation << ", index:" << ld.index
                      << ", unused:" << ld.unused << ", pointer:" << ld.pointer << '}';
        }